

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall
VmaBlockVector::AddDetailedStatistics(VmaBlockVector *this,VmaDetailedStatistics *inoutStats)

{
  bool bVar1;
  ulong uVar2;
  VmaBlockMetadata *pVVar3;
  uint uVar4;
  VmaMutexLockRead lock;
  VmaMutexLockRead local_28;
  
  bVar1 = this->m_hAllocator->m_UseMutex;
  uVar4 = 0;
  local_28.m_pMutex = (VmaRWMutex *)0x0;
  if (bVar1 != false) {
    local_28.m_pMutex = &this->m_Mutex;
  }
  if (bVar1 == true) {
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&this->m_Mutex);
  }
  uVar2 = (this->m_Blocks).m_Count;
  for (; uVar4 < uVar2; uVar4 = uVar4 + 1) {
    pVVar3 = (this->m_Blocks).m_pArray[uVar4]->m_pMetadata;
    (*pVVar3->_vptr_VmaBlockMetadata[0xe])(pVVar3,inoutStats);
  }
  VmaMutexLockRead::~VmaMutexLockRead(&local_28);
  return;
}

Assistant:

void VmaBlockVector::AddDetailedStatistics(VmaDetailedStatistics& inoutStats)
{
    VmaMutexLockRead lock(m_Mutex, m_hAllocator->m_UseMutex);

    const size_t blockCount = m_Blocks.size();
    for (uint32_t blockIndex = 0; blockIndex < blockCount; ++blockIndex)
    {
        const VmaDeviceMemoryBlock* const pBlock = m_Blocks[blockIndex];
        VMA_ASSERT(pBlock);
        VMA_HEAVY_ASSERT(pBlock->Validate());
        pBlock->m_pMetadata->AddDetailedStatistics(inoutStats);
    }
}